

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

void Gia_ObjSetGateLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  
  if (p->fGiaSimple == 0) {
    uVar6 = *(ulong *)pObj;
    if (((-1 < (int)(uint)uVar6) && (uVar8 = (uint)uVar6 & 0x1fffffff, uVar8 != 0x1fffffff)) &&
       (uVar8 == ((uint)(uVar6 >> 0x20) & 0x1fffffff))) {
      if ((uVar6 & 0x1fffffff) == 0x1fffffff) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x240,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar12 = pObj + -(uVar6 & 0x1fffffff);
      pGVar5 = p->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_006f8f50;
      uVar8 = (int)((long)pGVar12 - (long)pGVar5 >> 2) * -0x55555555;
      pVVar13 = p->vLevels;
      Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
      if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f6f;
      pGVar12 = p->pObjs;
      if ((pObj < pGVar12) || (pGVar12 + p->nObjs <= pObj)) goto LAB_006f8f50;
      iVar10 = pVVar13->pArray[uVar8 & 0x7fffffff];
      uVar8 = (int)((long)pObj - (long)pGVar12 >> 2) * -0x55555555;
      pVVar13 = p->vLevels;
      Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
      if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f8e;
      goto LAB_006f8f34;
    }
  }
  pGVar12 = p->pObjs;
  if ((pObj < pGVar12) || (pGVar5 = pGVar12 + p->nObjs, pGVar5 <= pObj)) {
LAB_006f8f50:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  puVar4 = p->pMuxes;
  if ((puVar4 == (uint *)0x0) ||
     (iVar10 = (int)((ulong)((long)pObj - (long)pGVar12) >> 2), puVar4[iVar10 * -0x55555555] == 0))
  {
    uVar6 = *(ulong *)pObj;
    uVar8 = (uint)uVar6;
    uVar9 = uVar6 & 0x1fffffff;
    bVar7 = uVar9 == 0x1fffffff || (int)uVar8 < 0;
    if ((bVar7) || (uVar11 = (uint)(uVar6 >> 0x20), (uVar11 & 0x1fffffff) <= (uVar8 & 0x1fffffff)))
    {
      if ((int)uVar9 == 0x1fffffff || (int)uVar8 < 0) {
        return;
      }
      if (bVar7) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x241,"void Gia_ObjSetAndLevel(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar1 = pObj + -uVar9;
      if ((pGVar1 < pGVar12) || (pGVar5 <= pGVar1)) goto LAB_006f8f50;
      uVar8 = (int)((long)pGVar1 - (long)pGVar12 >> 2) * -0x55555555;
      pVVar13 = p->vLevels;
      Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
      if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f6f;
      pGVar12 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar5 = p->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_006f8f50;
      iVar2 = pVVar13->pArray[uVar8 & 0x7fffffff];
      uVar8 = (int)((long)pGVar12 - (long)pGVar5 >> 2) * -0x55555555;
      pVVar13 = p->vLevels;
      Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
      if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f6f;
      pGVar12 = p->pObjs;
      if ((pObj < pGVar12) || (pGVar12 + p->nObjs <= pObj)) goto LAB_006f8f50;
      iVar10 = pVVar13->pArray[uVar8 & 0x7fffffff];
      uVar8 = (int)((long)pObj - (long)pGVar12 >> 2) * -0x55555555;
      pVVar13 = p->vLevels;
      Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
      if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f8e;
      if (iVar10 < iVar2) {
        iVar10 = iVar2;
      }
      iVar10 = iVar10 + 1;
      goto LAB_006f8f34;
    }
    if ((bVar7) || ((uVar11 & 0x1fffffff) <= (uVar8 & 0x1fffffff))) {
      __assert_fail("Gia_ObjIsXor(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x242,"void Gia_ObjSetXorLevel(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar1 = pObj + -uVar9;
    if ((pGVar1 < pGVar12) || (pGVar5 <= pGVar1)) goto LAB_006f8f50;
    uVar8 = (int)((long)pGVar1 - (long)pGVar12 >> 2) * -0x55555555;
    pVVar13 = p->vLevels;
    Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
    if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f6f;
    pGVar12 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    pGVar5 = p->pObjs;
    if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_006f8f50;
    iVar2 = pVVar13->pArray[uVar8 & 0x7fffffff];
    uVar8 = (int)((long)pGVar12 - (long)pGVar5 >> 2) * -0x55555555;
    pVVar13 = p->vLevels;
    Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
    if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f6f;
    pGVar12 = p->pObjs;
    if ((pObj < pGVar12) || (pGVar12 + p->nObjs <= pObj)) goto LAB_006f8f50;
    iVar10 = pVVar13->pArray[uVar8 & 0x7fffffff];
    uVar8 = (int)((long)pObj - (long)pGVar12 >> 2) * -0x55555555;
    pVVar13 = p->vLevels;
    Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
    if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) {
LAB_006f8f8e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    if (iVar10 < iVar2) {
      iVar10 = iVar2;
    }
  }
  else {
    if ((puVar4 == (uint *)0x0) || (puVar4[iVar10 * -0x55555555] == 0)) {
      __assert_fail("Gia_ObjIsMux(p,pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x243,"void Gia_ObjSetMuxLevel(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar1 = pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff);
    if ((pGVar1 < pGVar12) || (pGVar5 <= pGVar1)) goto LAB_006f8f50;
    uVar8 = (int)((long)pGVar1 - (long)pGVar12 >> 2) * -0x55555555;
    pVVar13 = p->vLevels;
    Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
    if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) {
LAB_006f8f6f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pGVar12 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    pGVar5 = p->pObjs;
    if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_006f8f50;
    iVar2 = pVVar13->pArray[uVar8 & 0x7fffffff];
    uVar8 = (int)((long)pGVar12 - (long)pGVar5 >> 2) * -0x55555555;
    pVVar13 = p->vLevels;
    Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
    if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f6f;
    iVar10 = pVVar13->pArray[uVar8 & 0x7fffffff];
    if (p->pMuxes == (uint *)0x0) {
      pGVar12 = (Gia_Obj_t *)0x0;
    }
    else {
      pGVar12 = p->pObjs;
      if ((pObj < pGVar12) || (pGVar12 + p->nObjs <= pObj)) goto LAB_006f8f50;
      uVar8 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar12) >> 2) * -0x55555555];
      if ((int)uVar8 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar8 = uVar8 >> 1;
      if (p->nObjs <= (int)uVar8) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar12 = pGVar12 + uVar8;
    }
    pGVar5 = p->pObjs;
    if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_006f8f50;
    uVar8 = (int)((long)pGVar12 - (long)pGVar5 >> 2) * -0x55555555;
    pVVar13 = p->vLevels;
    Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
    if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f6f;
    pGVar12 = p->pObjs;
    if ((pObj < pGVar12) || (pGVar12 + p->nObjs <= pObj)) goto LAB_006f8f50;
    iVar3 = pVVar13->pArray[uVar8 & 0x7fffffff];
    uVar8 = (int)((long)pObj - (long)pGVar12 >> 2) * -0x55555555;
    pVVar13 = p->vLevels;
    Vec_IntFillExtra(pVVar13,uVar8 + 1,0);
    if (((int)uVar8 < 0) || (pVVar13->nSize <= (int)uVar8)) goto LAB_006f8f8e;
    if (iVar10 < iVar2) {
      iVar10 = iVar2;
    }
    if (iVar10 <= iVar3) {
      iVar10 = iVar3;
    }
  }
  iVar10 = iVar10 + 2;
LAB_006f8f34:
  pVVar13->pArray[uVar8 & 0x7fffffff] = iVar10;
  return;
}

Assistant:

static inline void         Gia_ObjSetGateLevel( Gia_Man_t * p, Gia_Obj_t * pObj ){ if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) ) Gia_ObjSetBufLevel(p, pObj); else if ( Gia_ObjIsMux(p,pObj) ) Gia_ObjSetMuxLevel(p, pObj); else if ( Gia_ObjIsXor(pObj) ) Gia_ObjSetXorLevel(p, pObj); else if ( Gia_ObjIsAnd(pObj) ) Gia_ObjSetAndLevel(p, pObj); }